

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::ReadUSDZAssetInfoFromMemory
               (uint8_t *addr,size_t length,bool asset_on_memory,USDZAsset *asset,string *warn,
               string *err)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  mapped_type *this;
  uchar *__dest;
  pair<unsigned_long,_unsigned_long> local_78;
  ulong local_68;
  size_t i;
  undefined1 local_58 [8];
  vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
  assetInfos;
  string *err_local;
  string *warn_local;
  USDZAsset *asset_local;
  bool asset_on_memory_local;
  size_t length_local;
  uint8_t *addr_local;
  
  if (asset == (USDZAsset *)0x0) {
    addr_local._7_1_ = false;
  }
  else {
    assetInfos.
    super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)err;
    std::
    vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
    ::vector((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              *)local_58);
    bVar2 = anon_unknown_27::ParseUSDZHeader
                      (addr,length,
                       (vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                        *)local_58,warn,
                       &(assetInfos.
                         super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->filename);
    if (bVar2) {
      local_68 = 0;
      while( true ) {
        uVar1 = local_68;
        sVar3 = std::
                vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                ::size((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                        *)local_58);
        if (sVar3 <= uVar1) break;
        pvVar4 = std::
                 vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                               *)local_58,local_68);
        if (length < pvVar4->byte_begin) {
          if (assetInfos.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::__cxx11::string::operator+=
                      ((string *)
                       assetInfos.
                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "Invalid byte begin offset in USDZ asset header.");
          }
          addr_local._7_1_ = false;
          goto LAB_0014bf9d;
        }
        pvVar4 = std::
                 vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                               *)local_58,local_68);
        if (length < pvVar4->byte_end) {
          if (assetInfos.
              super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            ::std::__cxx11::string::operator+=
                      ((string *)
                       assetInfos.
                       super__Vector_base<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       "Invalid byte end offset in USDZ asset header.");
          }
          addr_local._7_1_ = false;
          goto LAB_0014bf9d;
        }
        pvVar4 = std::
                 vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                               *)local_58,local_68);
        pvVar5 = std::
                 vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                               *)local_58,local_68);
        local_78 = ::std::make_pair<unsigned_long&,unsigned_long&>
                             (&pvVar4->byte_begin,&pvVar5->byte_end);
        pvVar4 = std::
                 vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                 ::operator[]((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
                               *)local_58,local_68);
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
               ::operator[](&asset->asset_map,&pvVar4->filename);
        std::pair<unsigned_long,_unsigned_long>::operator=(this,&local_78);
        local_68 = local_68 + 1;
      }
      if (asset_on_memory) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&asset->data);
        asset->addr = addr;
        asset->size = length;
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&asset->data,length);
        __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&asset->data);
        memcpy(__dest,addr,length);
        asset->addr = (uint8_t *)0x0;
        asset->size = 0;
      }
      addr_local._7_1_ = true;
    }
    else {
      addr_local._7_1_ = false;
    }
LAB_0014bf9d:
    i._4_4_ = 1;
    std::
    vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
    ::~vector((vector<tinyusdz::(anonymous_namespace)::USDZAssetInfo,_std::allocator<tinyusdz::(anonymous_namespace)::USDZAssetInfo>_>
               *)local_58);
  }
  return addr_local._7_1_;
}

Assistant:

bool ReadUSDZAssetInfoFromMemory(const uint8_t *addr, const size_t length, const bool asset_on_memory, USDZAsset *asset,
  std::string *warn, std::string *err) {

  if (!asset) {
    return false;
  }

  std::vector<USDZAssetInfo> assetInfos;
  if (!ParseUSDZHeader(addr, length, &assetInfos, warn, err)) {
    return false;
  }

  for (size_t i = 0; i < assetInfos.size(); i++) {
    if (assetInfos[i].byte_begin > length) {
      if (err) {
        (*err) += "Invalid byte begin offset in USDZ asset header.";
      }
      return false;
    }
    if (assetInfos[i].byte_end > length) {
      if (err) {
        (*err) += "Invalid byte end offset in USDZ asset header.";
      }
      return false;
    }
    // Assume same filename does not exist.
    asset->asset_map[assetInfos[i].filename] = std::make_pair(assetInfos[i].byte_begin, assetInfos[i].byte_end);
  }

  if (asset_on_memory) {
    asset->data.clear();
    asset->addr = addr;
    asset->size = length;
  } else {
    // copy content
    asset->data.resize(length);
    memcpy(asset->data.data(), addr, length);
    asset->addr = nullptr;
    asset->size = 0;
  }

  return true;
}